

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day14a.cpp
# Opt level: O2

uint32_t day14a::get_index(string *input,int stretch)

{
  MD5Cache *cache;
  pointer pMVar1;
  char needle;
  char cVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int index;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  allocator_type local_79;
  int local_78;
  int local_74;
  long local_70;
  ulong local_68;
  long local_60;
  pointer local_58;
  ulong local_50;
  vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_> hash_cache;
  
  local_58 = (input->_M_dataplus)._M_p;
  local_74 = stretch;
  std::vector<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::vector
            (&hash_cache,1000,&local_79);
  (hash_cache.super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>._M_impl.
   super__Vector_impl_data._M_start)->index = -1;
  uVar7 = 0;
  lVar8 = 0x28;
  uVar6 = 1;
  lVar4 = 0x2c;
  local_78 = 0;
  do {
    cache = hash_cache.super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>.
            _M_impl.super__Vector_impl_data._M_start + uVar7 % 1000;
    if (hash_cache.super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>._M_impl.
        super__Vector_impl_data._M_start[uVar7 % 1000].index != (int)uVar7) {
      hash_and_stretch(local_58,(int)uVar7,local_74,cache);
    }
    needle = find_sequence<3>(cache->md5,'\0');
    lVar5 = lVar4;
    lVar9 = lVar8;
    uVar11 = uVar6;
    if (needle != '\0') {
      iVar10 = 1;
      local_70 = lVar4;
      local_68 = uVar6;
      local_60 = lVar8;
      local_50 = uVar7;
      do {
        pMVar1 = hash_cache.super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = uVar6 / 1000;
        lVar5 = local_70;
        uVar7 = local_50;
        lVar9 = local_60;
        uVar11 = local_68;
        if (iVar10 == 0x3e9) goto LAB_0010f61d;
        index = iVar10 + (int)local_50;
        if (index != *(int *)(hash_cache.
                              super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar3 * -1000].md5 +
                             lVar8 + -4)) {
          hash_and_stretch(local_58,index,local_74,
                           (MD5Cache *)
                           (hash_cache.
                            super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar3 * -1000].md5 + lVar8 + -4
                           ));
        }
        cVar2 = find_sequence<5>(pMVar1[uVar3 * -1000].md5 + lVar4 + -4,needle);
        uVar7 = local_50;
        iVar10 = iVar10 + 1;
        lVar8 = lVar8 + 0x28;
        uVar6 = uVar6 + 1;
        lVar4 = lVar4 + 0x28;
      } while (cVar2 == '\0');
      local_78 = local_78 + 1;
      lVar5 = local_70;
      lVar9 = local_60;
      uVar11 = local_68;
      if (local_78 == 0x40) {
        std::_Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>::~_Vector_base
                  (&hash_cache.
                    super__Vector_base<day14a::MD5Cache,_std::allocator<day14a::MD5Cache>_>);
        return (uint32_t)uVar7;
      }
    }
LAB_0010f61d:
    uVar7 = (ulong)((int)uVar7 + 1);
    lVar8 = lVar9 + 0x28;
    uVar6 = uVar11 + 1;
    lVar4 = lVar5 + 0x28;
  } while( true );
}

Assistant:

uint32_t get_index(const std::string& input, int stretch) {
		const char* key = input.c_str();
		std::vector<MD5Cache> hash_cache(1000);
		hash_cache[0].index = -1;
		for(int i = 0, found = 0;; ++i) {
			auto& hc = hash_cache[i % 1000];
			if(hc.index != i) {
				hash_and_stretch(key, i, stretch, hc);
			}
			char c = find_sequence<3>(hc.md5, 0);
			if(c != 0) {
				for(int j = i + 1; j <= i + 1000; ++j) {
					auto& hc = hash_cache[j % 1000];
					if(hc.index != j) {
						hash_and_stretch(key, j, stretch, hc);
					}
					if(find_sequence<5>(hc.md5, c)) {
						if(++found == 64) {
							return i;
						}
						break;
					}
				}
			}
		}
		return 0;
	}